

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

bool gompertz_check(double a,double b)

{
  char *pcVar1;
  
  if (a <= 1.0) {
    pcVar1 = "  A <= 1.0!\n";
  }
  else {
    if (0.0 < b) {
      return true;
    }
    pcVar1 = "  B <= 0.0!\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GOMPERTZ_CHECK - Warning!\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,0xc);
  return false;
}

Assistant:

bool gompertz_check ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    GOMPERTZ_CHECK checks the parameters of the Gompertz PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Johnson, Kotz, and Balakrishnan,
//    Continuous Univariate Distributions, Volume 2, second edition,
//    Wiley, 1994, pages 25-26.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    1 < A, 0 < B.
//
//    Output, bool GOMPERTZ_CHECK, is true if the parameters are legal.
//
{
  if ( a <= 1.0 )
  {
    cout << " \n";
    cout << "GOMPERTZ_CHECK - Warning!\n";
    cout << "  A <= 1.0!\n";
    return false;
  }

  if ( b <= 0.0 )
  {
    cout << " \n";
    cout << "GOMPERTZ_CHECK - Warning!\n";
    cout << "  B <= 0.0!\n";
    return false;
  }

  return true;
}